

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::extract_binary_string(string *__return_storage_ptr__,string *escaped_string)

{
  size_type sVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  sVar1 = escaped_string->_M_string_length;
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (escaped_string,0,3,"B\"(");
  if (iVar4 == 0) {
    lVar8 = 2;
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (escaped_string,sVar1 - 2,2,")\"");
    if (iVar4 == 0) {
      uVar9 = 3;
      goto LAB_00178d6d;
    }
  }
  uVar9 = 4;
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (escaped_string,0,4,"\'B\"(");
  if ((iVar4 != 0) ||
     (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(escaped_string,sVar1 - 3,3,")\"\'"), lVar8 = 3, iVar4 != 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,escaped_string);
    return __return_storage_ptr__;
  }
LAB_00178d6d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,(sVar1 - lVar8) - uVar9);
  do {
    if (sVar1 - lVar8 <= uVar9) {
      return __return_storage_ptr__;
    }
    pcVar2 = (escaped_string->_M_dataplus)._M_p;
    cVar3 = pcVar2[uVar9];
    if (cVar3 == '\\') {
      if ((byte)(pcVar2[uVar9 + 1] | 0x20U) != 0x78) {
        cVar3 = '\\';
        goto LAB_00178e04;
      }
      cVar3 = pcVar2[uVar9 + 3];
      uVar5 = hexConvert(pcVar2[uVar9 + 2]);
      uVar6 = hexConvert(cVar3);
      if (0xf < (uVar6 | uVar5)) {
        cVar3 = (escaped_string->_M_dataplus)._M_p[uVar9];
        goto LAB_00178e04;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(byte)(uVar5 << 4) | (byte)uVar6);
      lVar7 = 4;
    }
    else {
LAB_00178e04:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,cVar3);
      lVar7 = 1;
    }
    uVar9 = uVar9 + lVar7;
  } while( true );
}

Assistant:

CLI11_INLINE std::string extract_binary_string(const std::string &escaped_string) {
    std::size_t start{0};
    std::size_t tail{0};
    size_t ssize = escaped_string.size();
    if(escaped_string.compare(0, 3, "B\"(") == 0 && escaped_string.compare(ssize - 2, 2, ")\"") == 0) {
        start = 3;
        tail = 2;
    } else if(escaped_string.compare(0, 4, "'B\"(") == 0 && escaped_string.compare(ssize - 3, 3, ")\"'") == 0) {
        start = 4;
        tail = 3;
    }

    if(start == 0) {
        return escaped_string;
    }
    std::string outstring;

    outstring.reserve(ssize - start - tail);
    std::size_t loc = start;
    while(loc < ssize - tail) {
        // ssize-2 to skip )" at the end
        if(escaped_string[loc] == '\\' && (escaped_string[loc + 1] == 'x' || escaped_string[loc + 1] == 'X')) {
            auto c1 = escaped_string[loc + 2];
            auto c2 = escaped_string[loc + 3];

            std::uint32_t res1 = hexConvert(c1);
            std::uint32_t res2 = hexConvert(c2);
            if(res1 <= 0x0F && res2 <= 0x0F) {
                loc += 4;
                outstring.push_back(static_cast<char>(res1 * 16 + res2));
                continue;
            }
        }
        outstring.push_back(escaped_string[loc]);
        ++loc;
    }
    return outstring;
}